

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall
QPDFArgParser::addChoicesToCompletions
          (QPDFArgParser *this,option_table_t *option_table,string *option,string *extra_prefix)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *choice;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  OptionEntry *oe;
  string *extra_prefix_local;
  string *option_local;
  option_table_t *option_table_local;
  QPDFArgParser *this_local;
  
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
          ::count(option_table,option);
  if (sVar2 != 0) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
             ::operator[](option_table,option);
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pmVar3->choices);
    choice = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&pmVar3->choices);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&choice), bVar1) {
      local_50 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
      QTC::TC("libtests","QPDFArgParser complete choices",0);
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::operator+(&local_70,extra_prefix,local_50);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&peVar4->completions,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void
QPDFArgParser::addChoicesToCompletions(
    option_table_t& option_table, std::string const& option, std::string const& extra_prefix)
{
    if (option_table.count(option) != 0) {
        OptionEntry& oe = option_table[option];
        for (auto const& choice: oe.choices) {
            QTC::TC("libtests", "QPDFArgParser complete choices");
            m->completions.insert(extra_prefix + choice);
        }
    }
}